

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hash.c
# Opt level: O0

sx__hashtbl2 * sx__hashtbl2_create(sx_alloc *alloc,int capacity)

{
  code *pcVar1;
  sx__hashtbl2 *psVar2;
  uint32_t *puVar3;
  sx__hashtbl2 *tbl;
  int capacity_local;
  sx_alloc *alloc_local;
  
  if (capacity < 1) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-hash.c"
                      ,0x1a,"capacity > 0");
    pcVar1 = (code *)swi(3);
    psVar2 = (sx__hashtbl2 *)(*pcVar1)();
    return psVar2;
  }
  if (capacity != 10000) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-hash.c"
                      ,0x1b,"capacity == 10000");
    pcVar1 = (code *)swi(3);
    psVar2 = (sx__hashtbl2 *)(*pcVar1)();
    return psVar2;
  }
  psVar2 = (sx__hashtbl2 *)sx__malloc(alloc,0x19670,0,(char *)0x0,(char *)0x0,0);
  if (psVar2 == (sx__hashtbl2 *)0x0) {
    sx__mem_run_fail_callback
              ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-hash.c",
               0x21);
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-hash.c"
                      ,0x21,"Out of memory");
    pcVar1 = (code *)swi(3);
    psVar2 = (sx__hashtbl2 *)(*pcVar1)();
    return psVar2;
  }
  puVar3 = (uint32_t *)sx_align_ptr(psVar2 + 1,0,8);
  psVar2->keys = puVar3;
  psVar2->values = (int *)(psVar2->keys + 0x32c9);
  psVar2->count = 0;
  psVar2->capacity = 0x32c9;
  psVar2->_miss_cnt = 0;
  psVar2->_probe_cnt = 0;
  memset(psVar2->keys,0,0xcb24);
  return psVar2;
}

Assistant:

static sx__hashtbl2* sx__hashtbl2_create(const sx_alloc* alloc, int capacity)
{
    sx_assert(capacity > 0);
    sx_assert(capacity == 10000);
    capacity = 13001;
    sx__hashtbl2* tbl = (sx__hashtbl2*)sx_malloc(
        alloc, sizeof(sx__hashtbl2) + capacity * (sizeof(uint32_t) + sizeof(int)) +
                   SX_CONFIG_ALLOCATOR_NATURAL_ALIGNMENT);
    if (!tbl) {
        sx_out_of_memory();
        return NULL;
    }

    tbl->keys = (uint32_t*)sx_align_ptr(tbl + 1, 0, SX_CONFIG_ALLOCATOR_NATURAL_ALIGNMENT);
    tbl->values = (int*)(tbl->keys + capacity);
    tbl->count = 0;
    tbl->capacity = capacity;
#if SX_CONFIG_HASHTBL_DEBUG
    tbl->_miss_cnt = 0;
    tbl->_probe_cnt = 0;
#endif

    // Reset keys
    sx_memset(tbl->keys, 0x0, sizeof(uint32_t) * capacity);

    return tbl;
}